

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O3

int __thiscall
fmt::v8::
basic_format_args<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>_>,_char32_t>_>
::get_id<char32_t>(basic_format_args<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>_>,_char32_t>_>
                   *this,basic_string_view<char32_t> name)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  
  uVar5 = name.size_;
  if ((this->desc_ >> 0x3e & 1) != 0) {
    uVar7 = (ulong)(-1 < (long)this->desc_) << 4 | 0xffffffffffffffe0;
    lVar2 = *(long *)((long)&((this->field_1).values_)->field_0 + uVar7 + 8);
    if (lVar2 != 0) {
      lVar3 = *(long *)((long)&((this->field_1).values_)->field_0 + uVar7);
      lVar8 = 0;
      do {
        lVar4 = *(long *)(lVar3 + lVar8 * 0x10);
        uVar7 = 0xffffffffffffffff;
        uVar9 = 0;
        do {
          uVar6 = uVar9;
          lVar1 = uVar7 * 4;
          uVar7 = uVar7 + 1;
          uVar9 = uVar6 + 1;
        } while (*(int *)(lVar4 + 4 + lVar1) != 0);
        uVar9 = uVar5;
        if (uVar7 < uVar5) {
          uVar9 = uVar7;
        }
        if (uVar9 != 0) {
          if (uVar5 < uVar6) {
            uVar6 = uVar5;
          }
          uVar9 = 0;
          do {
            if (name.data_[uVar9] != *(char32_t *)(lVar4 + uVar9 * 4)) goto LAB_00170216;
            uVar9 = uVar9 + 1;
          } while (uVar6 != uVar9);
        }
        if (uVar5 == uVar7) {
          return *(int *)(lVar3 + 8 + lVar8 * 0x10);
        }
LAB_00170216:
        lVar8 = lVar8 + 1;
      } while (lVar8 != lVar2);
    }
  }
  return -1;
}

Assistant:

auto has_named_args() const -> bool {
    return (desc_ & detail::has_named_args_bit) != 0;
  }